

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

int ON_SHA1_Hash::Compare(ON_SHA1_Hash *a,ON_SHA1_Hash *b)

{
  ON__UINT8 *pOVar1;
  ON__UINT8 *pOVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x14) {
      return 0;
    }
    pOVar1 = a->m_digest + lVar3;
    pOVar2 = b->m_digest + lVar3;
    if (*pOVar1 < *pOVar2) break;
    lVar3 = lVar3 + 1;
    if (*pOVar2 < *pOVar1) {
      return 1;
    }
  }
  return -1;
}

Assistant:

int ON_SHA1_Hash::Compare(
  const ON_SHA1_Hash& a,
  const ON_SHA1_Hash& b
  )
{
  for (int i = 0; i < 20; i++)
  {
    if (a.m_digest[i] < b.m_digest[i])
      return -1;
    if (a.m_digest[i] > b.m_digest[i])
      return 1;
  }
  return 0;
}